

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3GenerateRowIndexDelete(Parse *pParse,Table *pTab,int iDataCur,int iIdxCur,int *aRegIdx)

{
  Index **ppIVar1;
  int regPrior;
  Index *pPrior;
  Index *pIVar2;
  Index *pIdx;
  int iPartIdxLabel;
  int *local_40;
  Vdbe *local_38;
  
  local_38 = pParse->pVdbe;
  pIdx = pTab->pIndex;
  if ((pTab->tabFlags & 0x20) != 0) {
    pIVar2 = pIdx;
    if (pIdx == (Index *)0x0) {
      return;
    }
    do {
      if ((pIVar2->field_0x5b & 3) == 2) goto LAB_00167ffd;
      ppIVar1 = &pIVar2->pNext;
      pIVar2 = *ppIVar1;
    } while (*ppIVar1 != (Index *)0x0);
  }
  pIVar2 = (Index *)0x0;
LAB_00167ffd:
  if (pIdx != (Index *)0x0) {
    regPrior = -1;
    pPrior = (Index *)0x0;
    local_40 = aRegIdx;
    do {
      if (local_40 == (int *)0x0) {
        if (pIdx != pIVar2) goto LAB_00168025;
      }
      else if ((pIdx != pIVar2) && (*aRegIdx != 0)) {
LAB_00168025:
        regPrior = sqlite3GenerateIndexKey(pParse,pIdx,iDataCur,0,1,&iPartIdxLabel,pPrior,regPrior);
        sqlite3VdbeAddOp3(local_38,0x6f,iIdxCur,regPrior,
                          (uint)(&pIdx->nKeyCol)[(pIdx->field_0x5b & 8) == 0]);
        sqlite3ResolvePartIdxLabel(pParse,iPartIdxLabel);
        pPrior = pIdx;
      }
      pIdx = pIdx->pNext;
      iIdxCur = iIdxCur + 1;
      aRegIdx = aRegIdx + 1;
    } while (pIdx != (Index *)0x0);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3GenerateRowIndexDelete(
  Parse *pParse,     /* Parsing and code generating context */
  Table *pTab,       /* Table containing the row to be deleted */
  int iDataCur,      /* Cursor of table holding data. */
  int iIdxCur,       /* First index cursor */
  int *aRegIdx       /* Only delete if aRegIdx!=0 && aRegIdx[i]>0 */
){
  int i;             /* Index loop counter */
  int r1 = -1;       /* Register holding an index key */
  int iPartIdxLabel; /* Jump destination for skipping partial index entries */
  Index *pIdx;       /* Current index */
  Index *pPrior = 0; /* Prior index */
  Vdbe *v;           /* The prepared statement under construction */
  Index *pPk;        /* PRIMARY KEY index, or NULL for rowid tables */

  v = pParse->pVdbe;
  pPk = HasRowid(pTab) ? 0 : sqlite3PrimaryKeyIndex(pTab);
  for(i=0, pIdx=pTab->pIndex; pIdx; i++, pIdx=pIdx->pNext){
    assert( iIdxCur+i!=iDataCur || pPk==pIdx );
    if( aRegIdx!=0 && aRegIdx[i]==0 ) continue;
    if( pIdx==pPk ) continue;
    VdbeModuleComment((v, "GenRowIdxDel for %s", pIdx->zName));
    r1 = sqlite3GenerateIndexKey(pParse, pIdx, iDataCur, 0, 1,
                                 &iPartIdxLabel, pPrior, r1);
    sqlite3VdbeAddOp3(v, OP_IdxDelete, iIdxCur+i, r1,
                      pIdx->uniqNotNull ? pIdx->nKeyCol : pIdx->nColumn);
    sqlite3ResolvePartIdxLabel(pParse, iPartIdxLabel);
    pPrior = pIdx;
  }
}